

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall
cmFindPackageCommand::SearchFrameworkPrefix(cmFindPackageCommand *this,string *prefix_in)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  string_view sVar4;
  undefined1 local_1b8 [8];
  cmFileListGeneratorGlob grGen;
  undefined1 local_160 [8];
  cmAppendPathSegmentGenerator vGen;
  undefined1 local_120 [8];
  cmAppendPathSegmentGenerator rGen;
  undefined1 local_e8 [8];
  cmMacProjectDirectoryListGenerator fwGen;
  undefined1 local_70 [8];
  cmCaseInsensitiveDirectoryListGenerator iCMakeGen;
  anon_class_8_1_8991fb9c searchFn;
  string prefix;
  string *prefix_in_local;
  cmFindPackageCommand *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  bVar3 = false;
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::back();
    bVar3 = *pcVar2 == '/';
  }
  if (!bVar3) {
    __assert_fail("!prefix_in.empty() && prefix_in.back() == \'/\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx"
                  ,0xa2a,"bool cmFindPackageCommand::SearchFrameworkPrefix(const std::string &)");
  }
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)&searchFn,(ulong)prefix_in);
  iCMakeGen._32_8_ = this;
  sVar4 = (string_view)::cm::operator____s("cmake",5);
  anon_unknown.dwarf_ad0985::cmCaseInsensitiveDirectoryListGenerator::
  cmCaseInsensitiveDirectoryListGenerator((cmCaseInsensitiveDirectoryListGenerator *)local_70,sVar4)
  ;
  sVar4 = (string_view)::cm::operator____s(".framework",10);
  rGen._16_8_ = sVar4._M_len;
  anon_unknown.dwarf_ad0985::cmMacProjectDirectoryListGenerator::cmMacProjectDirectoryListGenerator
            ((cmMacProjectDirectoryListGenerator *)local_e8,&this->Names,sVar4);
  sVar4 = (string_view)::cm::operator____s("Resources",9);
  vGen._16_8_ = sVar4._M_len;
  anon_unknown.dwarf_ad0985::cmAppendPathSegmentGenerator::cmAppendPathSegmentGenerator
            ((cmAppendPathSegmentGenerator *)local_120,sVar4);
  sVar4 = (string_view)::cm::operator____s("Versions",8);
  grGen.Current._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar4._M_len;
  anon_unknown.dwarf_ad0985::cmAppendPathSegmentGenerator::cmAppendPathSegmentGenerator
            ((cmAppendPathSegmentGenerator *)local_160,sVar4);
  sVar4 = (string_view)::cm::operator____s("/*/Resources",0xc);
  anon_unknown.dwarf_ad0985::cmFileListGeneratorGlob::cmFileListGeneratorGlob
            ((cmFileListGeneratorGlob *)local_1b8,sVar4);
  bVar3 = (anonymous_namespace)::
          TryGeneratedPaths<cmFindPackageCommand::SearchFrameworkPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmMacProjectDirectoryListGenerator&,(anonymous_namespace)::cmAppendPathSegmentGenerator&>
                    ((anon_class_8_1_8991fb9c *)&iCMakeGen.Loaded,(string *)&searchFn,
                     (cmMacProjectDirectoryListGenerator *)local_e8,
                     (cmAppendPathSegmentGenerator *)local_120);
  if (bVar3) {
    this_local._7_1_ = true;
  }
  else {
    bVar3 = (anonymous_namespace)::
            TryGeneratedPaths<cmFindPackageCommand::SearchFrameworkPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmMacProjectDirectoryListGenerator&,(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&>
                      ((anon_class_8_1_8991fb9c *)&iCMakeGen.Loaded,(string *)&searchFn,
                       (cmMacProjectDirectoryListGenerator *)local_e8,
                       (cmAppendPathSegmentGenerator *)local_120,
                       (cmCaseInsensitiveDirectoryListGenerator *)local_70);
    if (bVar3) {
      this_local._7_1_ = true;
    }
    else {
      bVar3 = (anonymous_namespace)::
              TryGeneratedPaths<cmFindPackageCommand::SearchFrameworkPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmMacProjectDirectoryListGenerator&,(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmFileListGeneratorGlob&>
                        ((anon_class_8_1_8991fb9c *)&iCMakeGen.Loaded,(string *)&searchFn,
                         (cmMacProjectDirectoryListGenerator *)local_e8,
                         (cmAppendPathSegmentGenerator *)local_160,
                         (cmFileListGeneratorGlob *)local_1b8);
      if (bVar3) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ =
             (anonymous_namespace)::
             TryGeneratedPaths<cmFindPackageCommand::SearchFrameworkPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmMacProjectDirectoryListGenerator&,(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmFileListGeneratorGlob&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&>
                       ((anon_class_8_1_8991fb9c *)&iCMakeGen.Loaded,(string *)&searchFn,
                        (cmMacProjectDirectoryListGenerator *)local_e8,
                        (cmAppendPathSegmentGenerator *)local_160,
                        (cmFileListGeneratorGlob *)local_1b8,
                        (cmCaseInsensitiveDirectoryListGenerator *)local_70);
      }
    }
  }
  anon_unknown.dwarf_ad0985::cmFileListGeneratorGlob::~cmFileListGeneratorGlob
            ((cmFileListGeneratorGlob *)local_1b8);
  anon_unknown.dwarf_ad0985::cmMacProjectDirectoryListGenerator::~cmMacProjectDirectoryListGenerator
            ((cmMacProjectDirectoryListGenerator *)local_e8);
  anon_unknown.dwarf_ad0985::cmCaseInsensitiveDirectoryListGenerator::
  ~cmCaseInsensitiveDirectoryListGenerator((cmCaseInsensitiveDirectoryListGenerator *)local_70);
  std::__cxx11::string::~string((string *)&searchFn);
  return this_local._7_1_;
}

Assistant:

bool cmFindPackageCommand::SearchFrameworkPrefix(std::string const& prefix_in)
{
  assert(!prefix_in.empty() && prefix_in.back() == '/');

  // Strip the trailing slash because the path generator is about to
  // add one.
  std::string const prefix = prefix_in.substr(0, prefix_in.size() - 1);

  auto searchFn = [this](const std::string& fullPath) -> bool {
    return this->SearchDirectory(fullPath);
  };

  auto iCMakeGen = cmCaseInsensitiveDirectoryListGenerator{ "cmake"_s };
  auto fwGen =
    cmMacProjectDirectoryListGenerator{ this->Names, ".framework"_s };
  auto rGen = cmAppendPathSegmentGenerator{ "Resources"_s };
  auto vGen = cmAppendPathSegmentGenerator{ "Versions"_s };
  auto grGen = cmFileListGeneratorGlob{ "/*/Resources"_s };

  // <prefix>/Foo.framework/Resources/
  if (TryGeneratedPaths(searchFn, prefix, fwGen, rGen)) {
    return true;
  }

  // <prefix>/Foo.framework/Resources/CMake/
  if (TryGeneratedPaths(searchFn, prefix, fwGen, rGen, iCMakeGen)) {
    return true;
  }

  // <prefix>/Foo.framework/Versions/*/Resources/
  if (TryGeneratedPaths(searchFn, prefix, fwGen, vGen, grGen)) {
    return true;
  }

  // <prefix>/Foo.framework/Versions/*/Resources/CMake/
  return TryGeneratedPaths(searchFn, prefix, fwGen, vGen, grGen, iCMakeGen);
}